

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  ExprList *pEVar1;
  FuncDef *zP4;
  int iVar2;
  int iVar3;
  Vdbe *v;
  AggInfo_func *pAVar4;
  
  if (0 < pAggInfo->nFunc) {
    pAVar4 = pAggInfo->aFunc;
    iVar3 = 0;
    do {
      pEVar1 = (pAVar4->pExpr->x).pList;
      iVar2 = 0;
      if (pEVar1 != (ExprList *)0x0) {
        iVar2 = pEVar1->nExpr;
      }
      zP4 = pAVar4->pFunc;
      iVar2 = sqlite3VdbeAddOp3((Vdbe *)pParse,0x7c,pAVar4->iMem,iVar2,0);
      sqlite3VdbeChangeP4((Vdbe *)pParse,iVar2,(char *)zP4,-5);
      iVar3 = iVar3 + 1;
      pAVar4 = pAVar4 + 1;
    } while (iVar3 < pAggInfo->nFunc);
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    sqlite3VdbeAddOp4(v, OP_AggFinal, pF->iMem, pList ? pList->nExpr : 0, 0,
                      (void*)pF->pFunc, P4_FUNCDEF);
  }
}